

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O0

ProceduralBlockSymbol *
slang::ast::ProceduralBlockSymbol::createProceduralBlock
          (Scope *scope,ProceduralBlockKind kind,SourceLocation location,bool isFromAssertion,
          MemberSyntax *syntax,StatementSyntax *stmtSyntax)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar1;
  ProceduralBlockSymbol *this;
  iterator ppSVar2;
  iterator ppSVar3;
  Scope *in_RDI;
  SyntaxNode *in_R8;
  StatementSyntax *in_R9;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar4;
  SyntaxNode *member;
  iterator __end2_1;
  iterator __begin2_1;
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> *__range2_1;
  StatementBlockSymbol *b;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> *__range2;
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> extraMembers;
  ProceduralBlockSymbol *result;
  Compilation *comp;
  SyntaxNode *in_stack_00000548;
  Scope *in_stack_00000550;
  Symbol *in_stack_fffffffffffffee8;
  ProceduralBlockSymbol *this_00;
  bool *in_stack_fffffffffffffef8;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
  *in_stack_ffffffffffffff00;
  SourceLocation *in_stack_ffffffffffffff08;
  BumpAllocator *in_stack_ffffffffffffff10;
  Scope *in_stack_ffffffffffffff18;
  Symbol *in_stack_ffffffffffffff20;
  pointer in_stack_ffffffffffffff28;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff30;
  SmallVectorBase<const_slang::syntax::SyntaxNode_*> *this_01;
  __normal_iterator<const_slang::ast::StatementBlockSymbol_*const_*,_std::span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL>_>
  local_b8;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> *local_b0;
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  undefined1 labelHandled;
  StatementSyntax *in_stack_ffffffffffffff78;
  Scope *in_stack_ffffffffffffff80;
  
  labelHandled = (undefined1)((ulong)in_stack_ffffffffffffff70 >> 0x38);
  Scope::getCompilation(in_RDI);
  this = BumpAllocator::
         emplace<slang::ast::ProceduralBlockSymbol,slang::SourceLocation&,slang::ast::ProceduralBlockKind&,bool&>
                   (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                    (ProceduralBlockKind *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  Symbol::setSyntax(&this->super_Symbol,in_R8);
  this_00 = this;
  std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
  span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
            (in_stack_ffffffffffffff00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_RDI)
  ;
  syntax_00._M_extent._M_extent_value = in_stack_ffffffffffffff30._M_extent_value;
  syntax_00._M_ptr = in_stack_ffffffffffffff28;
  Symbol::setAttributes(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,syntax_00);
  this->stmtSyntax = in_R9;
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL>::SmallVector
            ((SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> *)0x5c0f28);
  sVar4 = Statement::createBlockItems
                    (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(bool)labelHandled,
                     in_stack_ffffffffffffff68);
  this->blocks = sVar4;
  local_b0 = &this->blocks;
  local_b8._M_current =
       (StatementBlockSymbol **)
       std::span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> *)
                  in_stack_fffffffffffffee8);
  std::span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL>::end
            ((span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::StatementBlockSymbol_*const_*,_std::span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::StatementBlockSymbol_*const_*,_std::span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL>_>
                        *)this_00,
                       (__normal_iterator<const_slang::ast::StatementBlockSymbol_*const_*,_std::span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffee8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::StatementBlockSymbol_*const_*,_std::span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL>_>
    ::operator*(&local_b8);
    Scope::addMember((Scope *)this_00,in_stack_fffffffffffffee8);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::StatementBlockSymbol_*const_*,_std::span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL>_>
    ::operator++(&local_b8);
  }
  this_01 = (SmallVectorBase<const_slang::syntax::SyntaxNode_*> *)&stack0xffffffffffffff78;
  ppSVar2 = SmallVectorBase<const_slang::syntax::SyntaxNode_*>::begin(this_01);
  ppSVar3 = SmallVectorBase<const_slang::syntax::SyntaxNode_*>::end(this_01);
  for (; ppSVar2 != ppSVar3; ppSVar2 = ppSVar2 + 1) {
    Scope::addMembers(in_stack_00000550,in_stack_00000548);
  }
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> *)0x5c10a7);
  return this;
}

Assistant:

ProceduralBlockSymbol& ProceduralBlockSymbol::createProceduralBlock(
    Scope& scope, ProceduralBlockKind kind, SourceLocation location, bool isFromAssertion,
    const MemberSyntax& syntax, const StatementSyntax& stmtSyntax) {

    auto& comp = scope.getCompilation();
    auto result = comp.emplace<ProceduralBlockSymbol>(location, kind, isFromAssertion);
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);
    result->stmtSyntax = &stmtSyntax;

    SmallVector<const SyntaxNode*> extraMembers;
    result->blocks = Statement::createBlockItems(scope, stmtSyntax, /* labelHandled */ false,
                                                 extraMembers);

    for (auto b : result->blocks)
        scope.addMember(*b);
    for (auto member : extraMembers)
        scope.addMembers(*member);

    return *result;
}